

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O0

bool __thiscall libwebm::PesHeader::Write(PesHeader *this,bool write_pts,PacketDataBuffer *buffer)

{
  ushort uVar1;
  bool bVar2;
  size_t sVar3;
  value_type local_39;
  ulong uStack_38;
  uint8_t byte;
  size_t header_length;
  int i;
  int kStartCodeLength;
  PacketDataBuffer *buffer_local;
  PesHeader *pPStack_18;
  bool write_pts_local;
  PesHeader *this_local;
  
  _i = buffer;
  buffer_local._7_1_ = write_pts;
  pPStack_18 = this;
  if (buffer == (PacketDataBuffer *)0x0) {
    fprintf(_stderr,"Webm2Pes: nullptr in header writer.\n");
    this_local._7_1_ = false;
  }
  else {
    header_length._4_4_ = 4;
    for (header_length._0_4_ = 0; (int)header_length < 4;
        header_length._0_4_ = (int)header_length + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (_i,this->start_code + (int)header_length);
    }
    uVar1 = this->packet_length;
    sVar3 = PesOptionalHeader::size_in_bytes();
    uStack_38 = uVar1 + sVar3;
    if (uStack_38 < 0x10000) {
      local_39 = (value_type)(uStack_38 >> 8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(_i,&local_39);
      local_39 = (value_type)uStack_38;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(_i,&local_39);
      bVar2 = PesOptionalHeader::Write(&this->optional_header,(bool)(buffer_local._7_1_ & 1),_i);
      if (bVar2) {
        this_local._7_1_ = true;
      }
      else {
        fprintf(_stderr,"Webm2Pes: PES optional header write failed.");
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool PesHeader::Write(bool write_pts, PacketDataBuffer* buffer) const {
  if (buffer == nullptr) {
    std::fprintf(stderr, "Webm2Pes: nullptr in header writer.\n");
    return false;
  }

  // Write |start_code|.
  const int kStartCodeLength = 4;
  for (int i = 0; i < kStartCodeLength; ++i)
    buffer->push_back(start_code[i]);

  // The length field here reports number of bytes following the field. The
  // length of the optional header must be added to the payload length set by
  // the user.
  const std::size_t header_length =
      packet_length + optional_header.size_in_bytes();
  if (header_length > UINT16_MAX)
    return false;

  // Write |header_length| as big endian.
  std::uint8_t byte = (header_length >> 8) & 0xff;
  buffer->push_back(byte);
  byte = header_length & 0xff;
  buffer->push_back(byte);

  // Write the (not really) optional header.
  if (optional_header.Write(write_pts, buffer) != true) {
    std::fprintf(stderr, "Webm2Pes: PES optional header write failed.");
    return false;
  }
  return true;
}